

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O2

int bio_bytein(opj_bio_t *bio)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = bio->buf & 0xff;
  uVar3 = uVar2 << 8;
  bio->buf = uVar3;
  bio->ct = (uVar2 != 0xff) + 7;
  pbVar1 = bio->bp;
  if (pbVar1 < bio->end) {
    bio->bp = pbVar1 + 1;
    bio->buf = uVar3 | *pbVar1;
    return 0;
  }
  return 1;
}

Assistant:

static int bio_bytein(opj_bio_t *bio) {
	bio->buf = (bio->buf << 8) & 0xffff;
	bio->ct = bio->buf == 0xff00 ? 7 : 8;
	if (bio->bp >= bio->end) {
		return 1;
	}
	bio->buf |= *bio->bp++;
	return 0;
}